

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O0

REF_BOOL ref_dict_has_key(REF_DICT ref_dict,REF_INT key)

{
  int local_20;
  REF_INT i;
  REF_INT key_local;
  REF_DICT ref_dict_local;
  
  local_20 = 0;
  while( true ) {
    if (ref_dict->n <= local_20) {
      return 0;
    }
    if (key == ref_dict->key[local_20]) break;
    local_20 = local_20 + 1;
  }
  return 1;
}

Assistant:

REF_FCN REF_BOOL ref_dict_has_key(REF_DICT ref_dict, REF_INT key) {
  REF_INT i;

  for (i = 0; i < ref_dict_n(ref_dict); i++)
    if (key == ref_dict->key[i]) {
      return REF_TRUE;
    }

  return REF_FALSE;
}